

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::setSceneRect(QGraphicsScene *this,QRectF *rect)

{
  long lVar1;
  uint uVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  bool bVar6;
  QRectF *_t1;
  
  lVar1 = *(long *)(this + 8);
  bVar6 = ::operator!=(rect,(QRectF *)(lVar1 + 0x98));
  if (bVar6) {
    uVar2 = (uint)(rect->w != 0.0 || rect->h != 0.0);
    *(uint *)(lVar1 + 0xb8) = (*(uint *)(lVar1 + 0xb8) & 0xfffffffe) + uVar2;
    qVar3 = rect->xp;
    qVar4 = rect->yp;
    qVar5 = rect->h;
    *(qreal *)(lVar1 + 0xa8) = rect->w;
    *(qreal *)(lVar1 + 0xb0) = qVar5;
    ((QRectF *)(lVar1 + 0x98))->xp = qVar3;
    *(qreal *)(lVar1 + 0xa0) = qVar4;
    _t1 = (QRectF *)(lVar1 + 200);
    if ((-uVar2 & 1) != 0) {
      _t1 = rect;
    }
    sceneRectChanged(this,_t1);
    return;
  }
  return;
}

Assistant:

void QGraphicsScene::setSceneRect(const QRectF &rect)
{
    Q_D(QGraphicsScene);
    if (rect != d->sceneRect) {
        d->hasSceneRect = !rect.isNull();
        d->sceneRect = rect;
        emit sceneRectChanged(d->hasSceneRect ? rect : d->growingItemsBoundingRect);
    }
}